

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O0

string * __thiscall
flatbuffers::jsons::(anonymous_namespace)::GenArrayType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Type *type)

{
  BaseType type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string element_type;
  Type *type_local;
  
  element_type.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_38);
  if (*(long *)(element_type.field_2._8_8_ + 8) == 0) {
    if (*(long *)(element_type.field_2._8_8_ + 0x10) == 0) {
      GenType_abi_cxx11_(&local_a8,
                         (_anonymous_namespace_ *)(ulong)*(uint *)(element_type.field_2._8_8_ + 4),
                         type_00);
      std::__cxx11::string::operator=((string *)local_38,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      anon_unknown_1::GenTypeRef<flatbuffers::EnumDef>
                (&local_88,*(EnumDef **)(element_type.field_2._8_8_ + 0x10));
      std::__cxx11::string::operator=((string *)local_38,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
  }
  else {
    anon_unknown_1::GenTypeRef<flatbuffers::StructDef>
              (&local_58,*(StructDef **)(element_type.field_2._8_8_ + 8));
    std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::operator+(&local_c8,"\"type\" : \"array\", \"items\" : {",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(__return_storage_ptr__,&local_c8,"}");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenArrayType(const Type &type) {
  std::string element_type;
  if (type.struct_def != nullptr) {
    element_type = GenTypeRef(type.struct_def);
  } else if (type.enum_def != nullptr) {
    element_type = GenTypeRef(type.enum_def);
  } else {
    element_type = GenType(type.element);
  }

  return "\"type\" : \"array\", \"items\" : {" + element_type + "}";
}